

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O0

bool __thiscall DepsLog::OpenForWrite(DepsLog *this,string *path,string *err)

{
  bool bVar1;
  string *err_local;
  string *path_local;
  DepsLog *this_local;
  
  if (((this->needs_recompaction_ & 1U) == 0) || (bVar1 = Recompact(this,path,err), bVar1)) {
    if (this->file_ != (FILE *)0x0) {
      __assert_fail("!file_",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log.cc"
                    ,0x36,"bool DepsLog::OpenForWrite(const string &, string *)");
    }
    std::__cxx11::string::operator=((string *)&this->file_path_,(string *)path);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DepsLog::OpenForWrite(const string& path, string* err) {
  if (needs_recompaction_) {
    if (!Recompact(path, err))
      return false;
  }

  assert(!file_);
  file_path_ = path;  // we don't actually open the file right now, but will do
                      // so on the first write attempt
  return true;
}